

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fApiCase.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ApiCase::getSupportedExtensions
          (ApiCase *this,deUint32 numSupportedValues,deUint32 extension,
          vector<int,_std::allocator<int>_> *values)

{
  GLenum GVar1;
  deBool dVar2;
  TestLog *this_00;
  MessageBuilder *this_01;
  reference data;
  MessageBuilder local_1a8;
  int local_24;
  vector<int,_std::allocator<int>_> *pvStack_20;
  deInt32 numFormats;
  vector<int,_std::allocator<int>_> *values_local;
  deUint32 extension_local;
  deUint32 numSupportedValues_local;
  ApiCase *this_local;
  
  pvStack_20 = values;
  values_local._0_4_ = extension;
  values_local._4_4_ = numSupportedValues;
  _extension_local = this;
  do {
    glu::CallLogWrapper::glGetIntegerv(&this->super_CallLogWrapper,values_local._4_4_,&local_24);
    GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar1,"glGetIntegerv(numSupportedValues, &numFormats)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fApiCase.cpp"
                    ,0x69);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (local_24 == 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_1a8,(char (*) [38])"// No supported extensions available.");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize(pvStack_20,(long)local_24);
    do {
      GVar1 = (deUint32)values_local;
      data = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,0);
      glu::CallLogWrapper::glGetIntegerv(&this->super_CallLogWrapper,GVar1,data);
      GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar1,"glGetIntegerv(extension, &values[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fApiCase.cpp"
                      ,0x70);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  return;
}

Assistant:

void ApiCase::getSupportedExtensions (const deUint32 numSupportedValues, const deUint32 extension, std::vector<int>& values)
{
	deInt32 numFormats;
	GLU_CHECK_CALL(glGetIntegerv(numSupportedValues, &numFormats));
	if (numFormats == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "// No supported extensions available." << tcu::TestLog::EndMessage;
		return;
	}
	values.resize(numFormats);
	GLU_CHECK_CALL(glGetIntegerv(extension, &values[0]));
}